

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdbfile.cpp
# Opt level: O3

bool ReadDebugInfo(char *fileName,DebugInfo *to)

{
  pointer *ppCVar1;
  key_type *__k;
  ushort uVar2;
  iterator __position;
  size_type sVar3;
  pointer pcVar4;
  pointer pPVar5;
  size_type sVar6;
  bool bVar7;
  ErrorCode EVar8;
  uint32_t uVar9;
  int32_t iVar10;
  Record *pRVar11;
  size_t sVar12;
  SectionContrib *pSVar13;
  uint uVar14;
  long lVar15;
  SectionType SVar16;
  char *__format;
  uint32_t uVar17;
  ulong uVar18;
  __normal_iterator<PDBSymbol_*,_std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>_> __i;
  pointer pPVar19;
  short sVar20;
  long lVar21;
  Module *this;
  HashRecord *hashRecord;
  ulong uVar22;
  undefined8 uVar23;
  __node_base _Var24;
  size_type sVar25;
  pointer pPVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vector<SectionContrib,_std::allocator<SectionContrib>_> contributions;
  ModuleSymbolStream moduleSymbolStream;
  vector<PDBSymbol,_std::allocator<PDBSymbol>_> rvaSortedSymbols;
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  typeSizeCache;
  RVAToSymbolMap rvaToSymbol;
  CoalescedMSFStream symbolRecordStream;
  RawFile rawPdbFile;
  ImageSectionStream imageSectionStream;
  MemoryMappedFile pdbFile;
  ModuleInfoStream moduleInfoStream;
  TypeTable typeTable;
  InfoStream infoStream;
  SectionContributionStream sectionContributionStream;
  DBIStream dbiStream;
  vector<SectionContrib,_std::allocator<SectionContrib>_> local_308;
  undefined1 local_2e8 [20];
  int32_t iStack_2d4;
  undefined8 local_2d0;
  StreamHeader local_2c8;
  vector<PDBSymbol,_std::allocator<PDBSymbol>_> local_288;
  double local_268;
  double dStack_260;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_258;
  undefined1 local_220 [16];
  __node_base local_210;
  size_type sStack_208;
  float local_200;
  size_t local_1f8;
  __node_base_ptr p_Stack_1f0;
  DebugInfo *local_1e8;
  CoalescedMSFStream local_1e0;
  RawFile local_1c8;
  key_type local_188 [2];
  size_t local_180;
  ImageSectionStream local_178;
  MemoryMappedFile local_150;
  ModuleInfoStream local_138;
  TypeTable local_110;
  InfoStream local_e0;
  SectionContributionStream local_b8;
  DBIStream local_90;
  
  MemoryMappedFile::MemoryMappedFile(&local_150,fileName);
  if (local_150.baseAddress == (void *)0x0) {
    bVar7 = false;
    fprintf(_stderr,"  failed to memory-map PDB file \'%s\'\n",fileName);
    goto LAB_0010b1be;
  }
  EVar8 = PDB::ValidateFile(local_150.baseAddress);
  if (EVar8 != Success) {
    bVar7 = false;
    fprintf(_stderr,"  failed to validate PDB file \'%s\': error code %i\n",fileName,(ulong)EVar8);
    goto LAB_0010b1be;
  }
  PDB::CreateRawFile(&local_1c8,local_150.baseAddress);
  EVar8 = PDB::HasValidDBIStream(&local_1c8);
  if (EVar8 == Success) {
    PDB::InfoStream::InfoStream(&local_e0,&local_1c8);
    if (local_e0.m_usesDebugFastlink == true) {
      __format = "  PDB file \'%s\' uses unsupported option /DEBUG:FASTLINK\n";
LAB_0010b198:
      bVar7 = false;
      fprintf(_stderr,__format,fileName);
    }
    else {
      PDB::CreateDBIStream(&local_90,&local_1c8);
      EVar8 = PDB::DBIStream::HasValidImageSectionStream(&local_90,&local_1c8);
      if ((((EVar8 != Success) ||
           (EVar8 = PDB::DBIStream::HasValidPublicSymbolStream(&local_90,&local_1c8),
           EVar8 != Success)) ||
          (EVar8 = PDB::DBIStream::HasValidGlobalSymbolStream(&local_90,&local_1c8),
          EVar8 != Success)) ||
         (EVar8 = PDB::DBIStream::HasValidSectionContributionStream(&local_90,&local_1c8),
         EVar8 != Success)) {
        __format = "  PDB file \'%s\' does not have required DBI sections\n";
        goto LAB_0010b198;
      }
      ReadDebugInfo();
      fwrite("[      ]",8,1,_stderr);
      PDB::DBIStream::CreateImageSectionStream(&local_178,&local_90,&local_1c8);
      PDB::DBIStream::CreateModuleInfoStream(&local_138,&local_90,&local_1c8);
      PDB::DBIStream::CreateSectionContributionStream(&local_b8,&local_90,&local_1c8);
      PDB::DBIStream::CreateSymbolRecordStream(&local_1e0,&local_90,&local_1c8);
      local_308.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
      super__Vector_impl_data._M_start = (SectionContrib *)0x0;
      local_308.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
      super__Vector_impl_data._M_finish = (SectionContrib *)0x0;
      local_308.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (SectionContrib *)0x0;
      std::vector<SectionContrib,_std::allocator<SectionContrib>_>::reserve
                (&local_308,local_b8.m_count);
      std::vector<ContribInfo,_std::allocator<ContribInfo>_>::reserve
                (&to->m_Contribs,local_b8.m_count);
      if (local_b8.m_count != 0) {
        auVar27._8_4_ = (int)(local_b8.m_count >> 0x20);
        auVar27._0_8_ = local_b8.m_count;
        auVar27._12_4_ = 0x45300000;
        dStack_260 = auVar27._8_8_ - 1.9342813113834067e+25;
        local_268 = dStack_260 +
                    ((double)CONCAT44(0x43300000,(int)local_b8.m_count) - 4503599627370496.0);
        sVar20 = 1;
        lVar21 = 0;
        do {
          if (sVar20 == 0) {
            ReadDebugInfo();
          }
          uVar9 = PDB::ImageSectionStream::ConvertSectionOffsetToRVA
                            (&local_178,
                             *(uint16_t *)((long)&(local_b8.m_contributions)->section + lVar21),
                             *(uint32_t *)((long)&(local_b8.m_contributions)->offset + lVar21));
          if (uVar9 == 0) {
            fprintf(_stderr,"  Contribution (section %i, offset %i) has invalid RVA\n",
                    (ulong)*(ushort *)((long)&(local_b8.m_contributions)->section + lVar21),
                    (ulong)*(uint *)((long)&(local_b8.m_contributions)->offset + lVar21));
          }
          else {
            stack0xfffffffffffffd28 = 0;
            local_2e8._0_4_ =
                 ZEXT24(*(ushort *)((long)&(local_b8.m_contributions)->section + lVar21));
            uVar23 = *(undefined8 *)((long)&(local_b8.m_contributions)->offset + lVar21);
            local_2e8._4_4_ = (undefined4)uVar23;
            local_2e8._8_4_ = (undefined4)((ulong)uVar23 >> 0x20);
            uVar2 = *(ushort *)((long)&(local_b8.m_contributions)->moduleIndex + lVar21);
            local_2e8._12_4_ = ZEXT24(uVar2);
            uVar14 = *(uint *)((long)&(local_b8.m_contributions)->characteristics + lVar21);
            if (((byte)uVar14 & 0xe0) == 0x20) {
              local_2e8._16_4_ = 1;
LAB_0010b087:
              iStack_2d4 = 0;
            }
            else {
              uVar14 = uVar14 & 0xe0;
              if (uVar14 == 0x80) {
                local_2e8._16_4_ = 3;
                goto LAB_0010b087;
              }
              if (uVar14 == 0x40) {
                local_2e8._16_4_ = 2;
                goto LAB_0010b087;
              }
            }
            iVar10 = DebugInfo::GetObjectFileIndex(to,local_138.m_modules[uVar2].m_name);
            iStack_2d4 = iVar10;
            if (local_308.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_308.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<SectionContrib,std::allocator<SectionContrib>>::
              _M_realloc_insert<SectionContrib&>
                        ((vector<SectionContrib,std::allocator<SectionContrib>> *)&local_308,
                         (iterator)
                         local_308.
                         super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
                         .super__Vector_impl_data._M_finish,(SectionContrib *)local_2e8);
            }
            else {
              (local_308.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
               .super__Vector_impl_data._M_finish)->Type = local_2e8._16_4_;
              (local_308.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
               .super__Vector_impl_data._M_finish)->ObjFileIndex = iVar10;
              (local_308.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
               .super__Vector_impl_data._M_finish)->Section = local_2e8._0_4_;
              (local_308.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
               .super__Vector_impl_data._M_finish)->Offset = local_2e8._4_4_;
              (local_308.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
               .super__Vector_impl_data._M_finish)->Length = local_2e8._8_4_;
              (local_308.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
               .super__Vector_impl_data._M_finish)->Compiland = local_2e8._12_4_;
              local_308.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_308.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            local_220._8_4_ = local_2e8._16_4_;
            local_220._4_4_ = local_2e8._8_4_;
            local_220._0_4_ = iStack_2d4;
            __position._M_current =
                 (to->m_Contribs).super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (to->m_Contribs).super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<ContribInfo,std::allocator<ContribInfo>>::_M_realloc_insert<ContribInfo&>
                        ((vector<ContribInfo,std::allocator<ContribInfo>> *)&to->m_Contribs,
                         __position,(ContribInfo *)local_220);
            }
            else {
              (__position._M_current)->sectionType = local_2e8._16_4_;
              (__position._M_current)->objectFileIndex = iStack_2d4;
              (__position._M_current)->size = local_2e8._8_4_;
              ppCVar1 = &(to->m_Contribs).
                         super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppCVar1 = *ppCVar1 + 1;
            }
          }
          sVar20 = sVar20 + 1;
          lVar21 = lVar21 + 0x1c;
        } while (local_b8.m_count * 0x1c != lVar21);
      }
      local_220._0_8_ = &p_Stack_1f0;
      local_220._8_8_ = 1;
      local_210._M_nxt = (_Hash_node_base *)0x0;
      sStack_208 = 0;
      local_200 = 1.0;
      local_1f8 = 0;
      p_Stack_1f0 = (__node_base_ptr)0x0;
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::rehash((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)local_220,0x400);
      if (local_138.m_moduleCount != 0) {
        auVar28._8_4_ = (int)(local_138.m_moduleCount >> 0x20);
        auVar28._0_8_ = local_138.m_moduleCount;
        auVar28._12_4_ = 0x45300000;
        dStack_260 = auVar28._8_8_ - 1.9342813113834067e+25;
        local_268 = dStack_260 +
                    ((double)CONCAT44(0x43300000,(int)local_138.m_moduleCount) - 4503599627370496.0)
        ;
        uVar22 = 0;
        this = local_138.m_modules;
        local_1e8 = to;
        do {
          uVar22 = uVar22 + 1;
          if ((uVar22 & 0x7f) == 0) {
            ReadDebugInfo();
          }
          bVar7 = PDB::ModuleInfoStream::Module::HasSymbolStream(this);
          if (bVar7) {
            PDB::ModuleInfoStream::Module::CreateSymbolStream
                      ((ModuleSymbolStream *)local_2e8,this,&local_1c8);
            if (4 < (ulong)stack0xfffffffffffffd28) {
              uVar18 = 4;
              do {
                uVar2 = *(ushort *)(CONCAT44(local_2e8._12_4_,local_2e8._8_4_) + uVar18);
                ProcessSymbol(&local_178,
                              (Record *)(CONCAT44(local_2e8._12_4_,local_2e8._8_4_) + uVar18),
                              (RVAToSymbolMap *)local_220);
                uVar18 = uVar18 + (uVar2 - 2) + 7 & 0xfffffffffffffffc;
              } while (uVar18 < (ulong)stack0xfffffffffffffd28);
            }
            PDB::CoalescedMSFStream::~CoalescedMSFStream((CoalescedMSFStream *)local_2e8);
            to = local_1e8;
          }
          this = this + 1;
        } while (this != local_138.m_modules + local_138.m_moduleCount);
      }
      PDB::DBIStream::CreateGlobalSymbolStream((GlobalSymbolStream *)local_2e8,&local_90,&local_1c8)
      ;
      if ((local_2c8._0_8_ & 0xffffffff) != 0) {
        lVar21 = (local_2c8._0_8_ & 0xffffffff) << 3;
        uVar23 = local_2d0;
        do {
          pRVar11 = PDB::GlobalSymbolStream::GetRecord
                              ((GlobalSymbolStream *)local_2e8,&local_1e0,(HashRecord *)uVar23);
          ProcessSymbol(&local_178,pRVar11,(RVAToSymbolMap *)local_220);
          uVar23 = uVar23 + 8;
          lVar21 = lVar21 + -8;
        } while (lVar21 != 0);
      }
      PDB::CoalescedMSFStream::~CoalescedMSFStream((CoalescedMSFStream *)local_2e8);
      PDB::DBIStream::CreatePublicSymbolStream((PublicSymbolStream *)local_2e8,&local_90,&local_1c8)
      ;
      if ((local_2c8._0_8_ & 0xffffffff) != 0) {
        lVar21 = (local_2c8._0_8_ & 0xffffffff) << 3;
        uVar23 = local_2d0;
        do {
          pRVar11 = PDB::PublicSymbolStream::GetRecord
                              ((PublicSymbolStream *)local_2e8,&local_1e0,(HashRecord *)uVar23);
          ProcessSymbol(&local_178,pRVar11,(RVAToSymbolMap *)local_220);
          uVar23 = uVar23 + 8;
          lVar21 = lVar21 + -8;
        } while (lVar21 != 0);
      }
      PDB::CoalescedMSFStream::~CoalescedMSFStream((CoalescedMSFStream *)local_2e8);
      sVar6 = sStack_208;
      local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::reserve(&local_288,sStack_208);
      if (local_210._M_nxt != (_Hash_node_base *)0x0) {
        _Var24._M_nxt = local_210._M_nxt;
        do {
          std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::push_back
                    (&local_288,(value_type *)(_Var24._M_nxt + 2));
          _Var24._M_nxt = (_Var24._M_nxt)->_M_nxt;
        } while (_Var24._M_nxt != (_Hash_node_base *)0x0);
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)local_220);
      pPVar26 = local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pPVar5 = local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar15 = (long)local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar22 = (lVar15 >> 3) * 0x6db6db6db6db6db7;
        lVar21 = 0x3f;
        if (uVar22 != 0) {
          for (; uVar22 >> lVar21 == 0; lVar21 = lVar21 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<PDBSymbol*,std::vector<PDBSymbol,std::allocator<PDBSymbol>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ReadEverything(PDB::RawFile_const&,PDB::DBIStream_const&,DebugInfo&)::__1>>
                  (local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                   super__Vector_impl_data._M_finish,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar15 < 0x381) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<PDBSymbol*,std::vector<PDBSymbol,std::allocator<PDBSymbol>>>,__gnu_cxx::__ops::_Iter_comp_iter<ReadEverything(PDB::RawFile_const&,PDB::DBIStream_const&,DebugInfo&)::__1>>
                    (pPVar5,pPVar26);
        }
        else {
          pPVar19 = pPVar5 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<PDBSymbol*,std::vector<PDBSymbol,std::allocator<PDBSymbol>>>,__gnu_cxx::__ops::_Iter_comp_iter<ReadEverything(PDB::RawFile_const&,PDB::DBIStream_const&,DebugInfo&)::__1>>
                    (pPVar5,pPVar19);
          for (; pPVar19 != pPVar26; pPVar19 = pPVar19 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<PDBSymbol*,std::vector<PDBSymbol,std::allocator<PDBSymbol>>>,__gnu_cxx::__ops::_Val_comp_iter<ReadEverything(PDB::RawFile_const&,PDB::DBIStream_const&,DebugInfo&)::__1>>
                      (pPVar19);
          }
        }
      }
      if (sVar6 != 0) {
        PDB::CreateTPIStream((TPIStream *)local_2e8,&local_1c8);
        TypeTable::TypeTable(&local_110,(TPIStream *)local_2e8);
        local_258._M_buckets = &local_258._M_single_bucket;
        local_258._M_bucket_count = 1;
        local_258._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_258._M_element_count = 0;
        local_258._M_rehash_policy._M_max_load_factor = 1.0;
        local_258._M_rehash_policy._M_next_resize = 0;
        local_258._M_single_bucket = (__node_base_ptr)0x0;
        lVar21 = 0x30;
        sVar25 = sVar6;
        do {
          pPVar5 = local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (*(int *)((long)local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar21 + -0xc) == 0) {
            if (*(int *)((long)&((local_288.
                                  super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                                  super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar21
                        ) != 0) {
              __k = (key_type *)
                    ((long)&((local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>.
                              _M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                    lVar21);
              std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&local_258,__k);
              sVar12 = PDBGetTypeSize(&local_110,*__k);
              local_188[0] = *__k;
              local_180 = sVar12;
              std::
              _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_int_const,unsigned_long>>
                        ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&local_258,local_188);
              if (sVar12 != 0) {
                *(int *)((long)pPVar5 + lVar21 + -0xc) = (int)sVar12;
              }
            }
            pSVar13 = ContribFromSectionOffset
                                (local_308.
                                 super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 ((long)local_308.
                                        super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_308.
                                        super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555,*(uint32_t *)((long)pPVar5 + lVar21 + -8),
                                 *(uint32_t *)((long)pPVar5 + lVar21 + -4));
            if ((pSVar13 != (SectionContrib *)0x0) &&
               (pSVar13->Length <= *(int *)((long)pPVar5 + lVar21 + -0xc) - 1U)) {
              *(uint32_t *)((long)pPVar5 + lVar21 + -0xc) = pSVar13->Length;
            }
            if (((sVar25 != 1) &&
                (uVar14 = *(int *)((long)&(local_288.
                                           super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->section +
                                  lVar21) - *(int *)((long)pPVar5 + lVar21 + -0x10), uVar14 != 0))
               && (uVar14 <= *(int *)((long)pPVar5 + lVar21 + -0xc) - 1U)) {
              *(uint *)((long)pPVar5 + lVar21 + -0xc) = uVar14;
            }
          }
          lVar21 = lVar21 + 0x38;
          sVar25 = sVar25 - 1;
        } while (sVar25 != 0);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_258);
        TypeTable::~TypeTable(&local_110);
      }
      pPVar5 = local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        auVar29._8_4_ = (int)(sVar6 >> 0x20);
        auVar29._0_8_ = sVar6;
        auVar29._12_4_ = 0x45300000;
        dStack_260 = auVar29._8_8_ - 1.9342813113834067e+25;
        local_268 = dStack_260 + ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0);
        sVar20 = 1;
        pPVar26 = local_288.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          if (sVar20 == 0) {
            ReadDebugInfo();
          }
          uVar9 = pPVar26->length;
          pSVar13 = ContribFromSectionOffset
                              (local_308.
                               super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               ((long)local_308.
                                      super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_308.
                                      super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555,pPVar26->section,pPVar26->offset);
          if (pSVar13 == (SectionContrib *)0x0) {
            uVar17 = 0;
            SVar16 = Unknown;
          }
          else {
            SVar16 = pSVar13->Type;
            uVar17 = pSVar13->ObjFileIndex;
            if (uVar9 == 0) {
              uVar9 = pSVar13->Length;
            }
          }
          local_2e8._0_8_ = local_2e8 + 0x10;
          local_2e8._8_4_ = 0;
          local_2e8._12_4_ = 0;
          stack0xfffffffffffffd28 = stack0xfffffffffffffd28 & 0xffffffffffffff00;
          local_2c8.version = 0;
          local_2c8.headerSize = 0;
          local_2c8.typeIndexBegin = 0;
          local_2c8.typeIndexEnd = 0;
          sVar3 = (pPVar26->name)._M_string_length;
          local_258._M_buckets = &local_258._M_before_begin._M_nxt;
          if (sVar3 == 0) {
            local_258._M_before_begin._M_nxt = (_Hash_node_base *)0x3e656d616e6f6e3c;
            local_258._M_bucket_count = 8;
            local_258._M_element_count = local_258._M_element_count & 0xffffffffffffff00;
          }
          else {
            pcVar4 = (pPVar26->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>((string *)&local_258,pcVar4,pcVar4 + sVar3);
          }
          std::__cxx11::string::_M_assign((string *)local_2e8);
          if ((__node_base *)local_258._M_buckets != &local_258._M_before_begin) {
            operator_delete(local_258._M_buckets,
                            (ulong)((long)&(local_258._M_before_begin._M_nxt)->_M_nxt + 1));
          }
          local_2c8.typeIndexEnd = SVar16;
          local_2c8.typeIndexBegin = uVar9;
          local_2c8.headerSize = uVar17;
          local_2c8.version = DebugInfo::GetNameSpaceIndex(to,&pPVar26->name);
          std::vector<SymbolInfo,std::allocator<SymbolInfo>>::emplace_back<SymbolInfo&>
                    ((vector<SymbolInfo,std::allocator<SymbolInfo>> *)to,(SymbolInfo *)local_2e8);
          if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
            operator_delete((void *)local_2e8._0_8_,stack0xfffffffffffffd28 + 1);
          }
          pPVar26 = pPVar26 + 1;
          sVar20 = sVar20 + 1;
        } while (pPVar26 != pPVar5);
      }
      std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::~vector(&local_288);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_220);
      if (local_308.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
          super__Vector_impl_data._M_start != (SectionContrib *)0x0) {
        operator_delete(local_308.
                        super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_308.
                              super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_308.
                              super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      PDB::CoalescedMSFStream::~CoalescedMSFStream(&local_1e0);
      PDB::CoalescedMSFStream::~CoalescedMSFStream(&local_b8.m_stream);
      PDB::ModuleInfoStream::~ModuleInfoStream(&local_138);
      PDB::CoalescedMSFStream::~CoalescedMSFStream(&local_178.m_stream);
      bVar7 = true;
    }
    PDB::CoalescedMSFStream::~CoalescedMSFStream(&local_e0.m_stream);
  }
  else {
    bVar7 = false;
    fprintf(_stderr,"  PDB file \'%s\' does not have valid DBI stream, error code %i\n",fileName,
            (ulong)EVar8);
  }
  PDB::RawFile::~RawFile(&local_1c8);
LAB_0010b1be:
  MemoryMappedFile::~MemoryMappedFile(&local_150);
  return bVar7;
}

Assistant:

bool ReadDebugInfo(const char *fileName, DebugInfo &to)
{
    // open the PDB file
    MemoryMappedFile pdbFile(fileName);
    if (pdbFile.baseAddress == nullptr)
    {
        fprintf(stderr, "  failed to memory-map PDB file '%s'\n", fileName);
        return false;
    }
    PDB::ErrorCode errorCode = PDB::ValidateFile(pdbFile.baseAddress);
    if (errorCode != PDB::ErrorCode::Success)
    {
        fprintf(stderr, "  failed to validate PDB file '%s': error code %i\n", fileName, (int)errorCode);
        return false;
    }
    const PDB::RawFile rawPdbFile = PDB::CreateRawFile(pdbFile.baseAddress);
    errorCode = PDB::HasValidDBIStream(rawPdbFile);
    if (errorCode != PDB::ErrorCode::Success)
    {
        fprintf(stderr, "  PDB file '%s' does not have valid DBI stream, error code %i\n", fileName, (int)errorCode);
        return false;
    }
    const PDB::InfoStream infoStream(rawPdbFile);
    if (infoStream.UsesDebugFastLink())
    {
        fprintf(stderr, "  PDB file '%s' uses unsupported option /DEBUG:FASTLINK\n", fileName);
        return false;
    }
    const PDB::DBIStream dbiStream = PDB::CreateDBIStream(rawPdbFile);
    if (!HasValidDBIStreams(rawPdbFile, dbiStream))
    {
        fprintf(stderr, "  PDB file '%s' does not have required DBI sections\n", fileName);
        return false;
    }

    if (dbiStream.GetHeader().flags & 0x1)
    {
        printf("Warning: PDB file is created with incremental linking, some information might be misleading.\n");
    }
    if (dbiStream.GetHeader().flags & 0x2)
    {
        printf("Warning: PDB file is stripped, some information might be missing or misleading.\n");
    }

    ReadEverything(rawPdbFile, dbiStream, to);

    return true;
}